

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bool __thiscall buffer::push_data(buffer *this,iovec *iov,int cnt,int ignore)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t *psVar6;
  
  iVar5 = 0;
  if (0 < cnt) {
    iVar5 = cnt;
  }
  psVar6 = &iov->iov_len;
  iVar4 = 0;
  iVar3 = 0;
  do {
    if (iVar5 == iVar3) {
LAB_001070ee:
      return cnt <= iVar3;
    }
    iVar2 = (int)*psVar6;
    if (iVar2 - ignore != 0 && ignore <= iVar2) {
      bVar1 = push_data(this,(char *)((long)ignore + (long)((iovec *)(psVar6 + -1))->iov_base),
                        iVar2 - ignore);
      if (!bVar1) {
        this->end_ = this->end_ + -(long)iVar4;
        goto LAB_001070ee;
      }
      iVar2 = (int)*psVar6;
      iVar4 = (iVar4 - ignore) + iVar2;
    }
    ignore = ignore - iVar2;
    if (ignore < 1) {
      ignore = 0;
    }
    iVar3 = iVar3 + 1;
    psVar6 = psVar6 + 2;
  } while( true );
}

Assistant:

bool buffer::push_data(iovec *iov, int cnt, int ignore)
{
    int pushed = 0;
    for (int i = 0; i < cnt; i++, iov++)
    {
        if (ignore < (int)iov->iov_len)
        {
            if (!push_data((char*)iov->iov_base + ignore, iov->iov_len - ignore))
            {
                end_ -= pushed;
                return false;
            }
            pushed += iov->iov_len - ignore;
        }
        ignore = std::max<int>(0, ignore - iov->iov_len);
    }
    return true;
}